

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

string * __thiscall
MinVR::VRDataIndex::addData(VRDataIndex *this,string *name,VRFloatArrayConvertible *object)

{
  undefined8 *in_RCX;
  VRFloatArray *in_RDX;
  string *in_RSI;
  VRDataIndex *in_RDI;
  string *key;
  VRDataIndex *this_00;
  
  key = in_RSI;
  this_00 = in_RDI;
  (**(code **)*in_RCX)();
  addData(this_00,key,in_RDX);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_RSI);
  return (string *)in_RDI;
}

Assistant:

std::string addData(const std::string &name, const VRFloatArrayConvertible &object) {
    return addData(name, object.toVRFloatArray());
  }